

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserErrors error;
  uint uVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  byte bVar5;
  char *msg;
  int iVar6;
  uint uVar7;
  
  pxVar3 = ctxt->input;
  pxVar1 = pxVar3->cur;
  if ((*pxVar1 == '&') && (pxVar1[1] == '#')) {
    if (pxVar1[2] == 'x') {
      pxVar3->cur = pxVar1 + 3;
      pxVar3->col = pxVar3->col + 3;
      if (pxVar1[3] == '\0') {
        xmlParserInputGrow(pxVar3,0xfa);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      uVar7 = 0;
      iVar6 = 0;
      while( true ) {
        pxVar3 = ctxt->input;
        pbVar4 = pxVar3->cur;
        bVar5 = *pbVar4;
        if (bVar5 == 0x3b) break;
        if (iVar6 < 0x15) {
          iVar6 = iVar6 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pbVar4 < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return 0;
          }
          bVar5 = *ctxt->input->cur;
          iVar6 = 0;
        }
        uVar2 = (uint)bVar5;
        if (9 < (byte)(bVar5 - 0x30)) {
          if (bVar5 < 0x61) {
            if (((bVar5 < 0x41) || (0x46 < bVar5)) || (0x13 < iVar6)) goto LAB_001579a0;
            uVar7 = (uVar7 * 0x10 + uVar2) - 0x37;
            goto LAB_00157873;
          }
          if ((bVar5 < 0x67) && (iVar6 < 0x14)) {
            uVar7 = (uVar7 * 0x10 + uVar2) - 0x57;
            goto LAB_00157873;
          }
LAB_001579a0:
          error = XML_ERR_INVALID_HEX_CHARREF;
LAB_001579a5:
          xmlFatalErr(ctxt,error,(char *)0x0);
          pxVar3 = ctxt->input;
          pbVar4 = pxVar3->cur;
          uVar2 = 0;
          uVar7 = 0;
          if (*pbVar4 == 0x3b) break;
          goto LAB_001578a2;
        }
        uVar7 = (uVar7 * 0x10 + uVar2) - 0x30;
LAB_00157873:
        if (0x10ffff < (int)uVar7) {
          uVar7 = 0x110000;
        }
        xmlNextChar(ctxt);
        iVar6 = iVar6 + 1;
      }
    }
    else {
      pxVar3->cur = pxVar1 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar1[2] == '\0') {
        xmlParserInputGrow(pxVar3,0xfa);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      uVar7 = 0;
      iVar6 = 0;
      while( true ) {
        pxVar3 = ctxt->input;
        pbVar4 = pxVar3->cur;
        bVar5 = *pbVar4;
        if (bVar5 == 0x3b) break;
        if (iVar6 < 0x15) {
          iVar6 = iVar6 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pbVar4 < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return 0;
          }
          bVar5 = *ctxt->input->cur;
          iVar6 = 0;
        }
        if (9 < (byte)(bVar5 - 0x30)) {
          error = XML_ERR_INVALID_DEC_CHARREF;
          goto LAB_001579a5;
        }
        uVar7 = (uVar7 * 10 + (uint)bVar5) - 0x30;
        if (0x10ffff < (int)uVar7) {
          uVar7 = 0x110000;
        }
        xmlNextChar(ctxt);
        iVar6 = iVar6 + 1;
      }
    }
    uVar2 = uVar7;
    pxVar3->col = pxVar3->col + 1;
    pxVar3->cur = pbVar4 + 1;
    if (0x10ffff < (int)uVar2) {
      msg = "xmlParseCharRef: character reference out of bounds\n";
      goto LAB_001578b2;
    }
    if ((int)uVar2 < 0x100) {
      if (0x1f < (int)uVar2) {
        return uVar2;
      }
      if ((uVar2 < 0xe) && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)) {
        return uVar2;
      }
    }
    else if (uVar2 - 0x10000 < 0xffffd800 || uVar2 - 0xe000 < 0x1ffe) {
      return uVar2;
    }
  }
  else {
    uVar2 = 0;
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
LAB_001578a2:
  msg = "xmlParseCharRef: invalid xmlChar value %d\n";
LAB_001578b2:
  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,msg,uVar2);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}